

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O0

void __thiscall p2t::Triangle::MarkNeighbor(Triangle *this,Triangle *t)

{
  bool bVar1;
  Triangle *t_local;
  Triangle *this_local;
  
  bVar1 = Contains(t,this->points_[1],this->points_[2]);
  if (bVar1) {
    this->neighbors_[0] = t;
    MarkNeighbor(t,this->points_[1],this->points_[2],this);
  }
  else {
    bVar1 = Contains(t,this->points_[0],this->points_[2]);
    if (bVar1) {
      this->neighbors_[1] = t;
      MarkNeighbor(t,this->points_[0],this->points_[2],this);
    }
    else {
      bVar1 = Contains(t,this->points_[0],this->points_[1]);
      if (bVar1) {
        this->neighbors_[2] = t;
        MarkNeighbor(t,this->points_[0],this->points_[1],this);
      }
    }
  }
  return;
}

Assistant:

void Triangle::MarkNeighbor(Triangle& t)
{
  if (t.Contains(points_[1], points_[2])) {
    neighbors_[0] = &t;
    t.MarkNeighbor(points_[1], points_[2], this);
  } else if (t.Contains(points_[0], points_[2])) {
    neighbors_[1] = &t;
    t.MarkNeighbor(points_[0], points_[2], this);
  } else if (t.Contains(points_[0], points_[1])) {
    neighbors_[2] = &t;
    t.MarkNeighbor(points_[0], points_[1], this);
  }
}